

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O2

void __thiscall
webfront::log::
debug<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::debug
          (debug<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,string_view fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,srcLoc *l)

{
  double __x;
  string local_30;
  
  if (logTypeEnabled._4_1_ == '\x01') {
    std::format<std::__cxx11::string>(&local_30,fmt,ts);
    anon_unknown_3::log(__x);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

debug(string_view fmt, Ts&&... ts, const srcLoc& l = srcLoc::current()) {
    if (is(Debug)) log(Debug, fmt, l, std::forward<Ts>(ts)...);
    }